

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O2

int __thiscall
chrono::ChLinkMask::SetActiveRedundantByArray(ChLinkMask *this,int *mvector,int mcount)

{
  ChConstraintTwoBodies *pCVar1;
  undefined4 extraout_var;
  int iVar2;
  int i;
  long lVar3;
  ulong uVar4;
  int i_1;
  ChLinkMask newmask;
  ChLinkMask local_58;
  
  ChLinkMask(&local_58,this);
  for (uVar4 = 0; uVar4 != (uint)(~(mcount >> 0x1f) & mcount); uVar4 = uVar4 + 1) {
    iVar2 = 0;
    for (lVar3 = 0; lVar3 < this->nconstr; lVar3 = lVar3 + 1) {
      if (((this->constraints).
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar3]->super_ChConstraintTwo).
          super_ChConstraint.active == true) {
        if (iVar2 == mvector[uVar4]) {
          pCVar1 = local_58.constraints.
                   super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar3];
          (pCVar1->super_ChConstraintTwo).super_ChConstraint.redundant = true;
          ChConstraint::UpdateActiveFlag((ChConstraint *)pCVar1);
        }
        iVar2 = iVar2 + 1;
      }
    }
  }
  for (lVar3 = 0; lVar3 < this->nconstr; lVar3 = lVar3 + 1) {
    pCVar1 = (this->constraints).
             super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar3];
    if (pCVar1 != (ChConstraintTwoBodies *)0x0) {
      (**(code **)((long)(pCVar1->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 8))
                ();
    }
    iVar2 = (*(local_58.constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar3]->super_ChConstraintTwo).
              super_ChConstraint._vptr_ChConstraint[2])();
    (this->constraints).
    super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
    ._M_impl.super__Vector_impl_data._M_start[lVar3] =
         (ChConstraintTwoBodies *)CONCAT44(extraout_var,iVar2);
  }
  ~ChLinkMask(&local_58);
  return mcount;
}

Assistant:

int ChLinkMask::SetActiveRedundantByArray(int* mvector, int mcount) {
    int cnt;

    ChLinkMask newmask = *this;
    for (int elem = 0; elem < mcount; elem++) {
        cnt = 0;
        for (int i = 0; i < nconstr; i++) {
            if (constraints[i]->IsActive()) {
                if (cnt == mvector[elem])
                    newmask.constraints[i]->SetRedundant(true);
                cnt++;
            }
        }
    }

    // Replace the mask with updated one.
    for (int i = 0; i < nconstr; i++) {
        delete constraints[i];
        constraints[i] = newmask.constraints[i]->Clone();
    }

    return mcount;
}